

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

BOOL CRTInitStdStreams(void)

{
  PAL_Stdout.bsdFilePtr = _stdout;
  PAL_Stdout.PALferrorCode = 0;
  PAL_Stdout.bTextMode = 1;
  PAL_Stdin.bsdFilePtr = _stdin;
  PAL_Stdin.PALferrorCode = 0;
  PAL_Stdin.bTextMode = 1;
  PAL_Stderr.bsdFilePtr = _stderr;
  PAL_Stderr.PALferrorCode = 0;
  PAL_Stderr.bTextMode = 1;
  return 1;
}

Assistant:

BOOL CRTInitStdStreams()
{
    /* stdout */
    PAL_Stdout.bsdFilePtr = stdout;
    PAL_Stdout.PALferrorCode = PAL_FILE_NOERROR;
    PAL_Stdout.bTextMode = TRUE;

    /* stdin */
    PAL_Stdin.bsdFilePtr = stdin;
    PAL_Stdin.PALferrorCode = PAL_FILE_NOERROR;
    PAL_Stdin.bTextMode = TRUE;

    /* stderr */
    PAL_Stderr.bsdFilePtr = stderr;
    PAL_Stderr.PALferrorCode = PAL_FILE_NOERROR;
    PAL_Stderr.bTextMode = TRUE;
    return TRUE;
}